

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg-inl.h
# Opt level: O0

void __thiscall
spdlog::details::log_msg::log_msg
          (log_msg *this,source_loc loc,string_view_t a_logger_name,level_enum lvl,string_view_t msg
          )

{
  string_view_t a_logger_name_00;
  source_loc loc_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  time_point in_R8;
  log_msg *in_R9;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)&stack0x00000008;
  details::os::now();
  loc_00._8_8_ = in_RDX;
  loc_00.filename = (char *)in_RSI;
  loc_00.funcname = (char *)*puVar1;
  a_logger_name_00.size_ = (size_t)puVar1;
  a_logger_name_00.data_ = in_RDI;
  log_msg(in_R9,in_R8,loc_00,a_logger_name_00,in_R8.__d.__r._4_4_,*(string_view_t *)(puVar1 + 1));
  return;
}

Assistant:

SPDLOG_INLINE log_msg::log_msg(spdlog::source_loc loc,
                               string_view_t a_logger_name,
                               spdlog::level::level_enum lvl,
                               spdlog::string_view_t msg)
    : log_msg(os::now(), loc, a_logger_name, lvl, msg) {}